

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forces_and_moments.cpp
# Opt level: O3

void __thiscall ElasticSupport::addAnEquation(ElasticSupport *this,Balk *balk)

{
  pointer pdVar1;
  pointer psVar2;
  ElasticSupport *pEVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar5 = 0;
  Balk::func(balk,0,(double)(this->super_Term).shift * (this->super_Term).segment_length);
  psVar2 = (balk->terms).
           super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pEVar3 = (ElasticSupport *)(psVar2->super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (pEVar3 != this) {
    do {
      uVar4 = (int)uVar5 + (uint)(pEVar3->super_Term).is_unknown;
      uVar5 = (ulong)uVar4;
      pEVar3 = (ElasticSupport *)
               psVar2[1].super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      psVar2 = psVar2 + 1;
    } while (pEVar3 != this);
    uVar5 = (ulong)uVar4;
  }
  if (psVar2 != (balk->terms).
                super__Vector_base<std::shared_ptr<Term>,_std::allocator<std::shared_ptr<Term>_>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
    pdVar1 = (balk->A).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar1[uVar5] = 1.0 / (balk->E * balk->J * this->k) + pdVar1[uVar5];
    return;
  }
  __assert_fail("it != balk.getTerms().end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/maksimkulis[P]balk_cpp/src/forces_and_moments.cpp"
                ,0x6a,"virtual void ElasticSupport::addAnEquation(Balk &) const");
}

Assistant:

void ElasticSupport::addAnEquation(Balk &balk) const
{
    balk.func(0, shift * segment_length);
    int ind_in_A = 0;
    auto it = balk.getTerms().begin();
    while (this != it->get())
    {
        if (it->get()->isUnknown())
        {
            ++ind_in_A;
        }
        ++it;
    }
    assert(it != balk.getTerms().end());
    balk.getA().back()[ind_in_A] += 1 / (k * balk.getEJ());
}